

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDataflow_cpp.h
# Opt level: O2

bool __thiscall moira::Moira::writeOp<(moira::Mode)2,(moira::Size)1,64ul>(Moira *this,int n,u32 val)

{
  u32 addr;
  
  addr = computeEA<(moira::Mode)2,(moira::Size)1,0ul>(this,n);
  writeM<(moira::MemSpace)1,(moira::Size)1,64ul>(this,addr,val);
  return true;
}

Assistant:

bool
Moira::writeOp(int n, u32 val)
{
    // Handle non-memory modes
    if (M == MODE_DN) { writeD<S>(n, val); return true;  }
    if (M == MODE_AN) { writeA<S>(n, val); return true;  }
    if (M == MODE_IM) { assert(false);     return false; }

    // Compute effective address
    u32 ea = computeEA<M,S>(n);

    // Write to effective address
    bool error; writeM <M,S,F> (ea, val, error);

    // Emulate -(An) register modification
    updateAnPD<M,S>(n);

    // Early exit in case of an address error
    if (error) return false;
    
    // Emulate (An)+ register modification
    updateAnPI<M,S>(n);
    
    return !error;
}